

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multipcm.c
# Opt level: O1

UINT8 device_start_multipcm(DEV_GEN_CFG *cfg,DEV_INFO *retDevInf)

{
  double dVar1;
  UINT8 UVar2;
  int iVar3;
  DEV_DATA DVar4;
  long lVar5;
  INT32 *pIVar6;
  INT32 (*paIVar7) [256];
  long lVar8;
  int iVar9;
  int iVar10;
  MultiPCM *ptChip;
  ulong uVar11;
  INT32 (*paIVar12) [256];
  long lVar13;
  long lVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  
  DVar4.chipInf = calloc(1,0x2658);
  if ((DEV_DATA *)DVar4.chipInf == (DEV_DATA *)0x0) {
    UVar2 = 0xff;
  }
  else {
    ((DEV_DATA *)((long)DVar4.chipInf + 0x2648))->chipInf = (void *)0x0;
    ((DEV_DATA *)((long)DVar4.chipInf + 0x2650))->chipInf = (void *)0x0;
    *(float *)((long)DVar4.chipInf + 0x143c) = (float)cfg->clock / 224.0;
    if (IsInit == '\0') {
      IsInit = '\x01';
      lVar14 = 0;
      lVar8 = 0;
      do {
        fVar15 = powf(10.0,((float)(int)lVar8 * -24.0 * 0.015625) / 20.0);
        lVar5 = 0x10;
        uVar11 = 0;
        lVar13 = lVar14;
        do {
          iVar3 = (int)uVar11;
          if (iVar3 == 8) {
            fVar16 = 0.0;
            fVar17 = 0.0;
          }
          else if (iVar3 == 0) {
            fVar17 = 1.0;
            fVar16 = 1.0;
          }
          else if (uVar11 < 8) {
            fVar16 = powf(10.0,((float)iVar3 * -12.0 * 0.25) / 20.0);
            fVar17 = 0.0;
            if (lVar5 != 9) {
              fVar17 = fVar16;
            }
            fVar16 = 1.0;
          }
          else {
            fVar17 = powf(10.0,((float)(int)(uint)lVar5 * -12.0 * 0.25) / 20.0);
            fVar16 = 0.0;
            if ((~(uint)lVar5 & 7) != 0) {
              fVar16 = fVar17;
            }
            fVar17 = 1.0;
          }
          *(int *)((long)left_pan_table + lVar13) = (int)(long)(fVar17 * fVar15 * 0.25 * 4096.0);
          *(int *)((long)right_pan_table + lVar13) = (int)(long)(fVar16 * fVar15 * 0.25 * 4096.0);
          uVar11 = uVar11 + 1;
          lVar13 = lVar13 + 0x200;
          lVar5 = lVar5 + -1;
        } while (lVar5 != 0);
        lVar8 = lVar8 + 1;
        lVar14 = lVar14 + 4;
      } while (lVar8 != 0x80);
      pIVar6 = linear_to_exp_volume;
      lVar8 = 0;
      do {
        fVar15 = powf(10.0,((float)(int)lVar8 * 96.0 * -0.0009765625 + 96.0) / -20.0);
        *pIVar6 = (INT32)(long)(fVar15 * 4096.0);
        lVar8 = lVar8 + 1;
        pIVar6 = pIVar6 + 1;
      } while (lVar8 != 0x400);
      iVar3 = 0x80;
      lVar8 = 0x200;
      lVar14 = 0;
      uVar11 = 0;
      do {
        iVar10 = (int)lVar8;
        if (uVar11 < 0x40) {
          *(int *)((long)pitch_table + lVar14) = iVar3;
        }
        else {
          if (uVar11 < 0x80) {
            iVar9 = iVar10 + -0x81;
          }
          else if (uVar11 < 0xc0) {
            iVar9 = iVar10 + -0x80;
          }
          else {
            iVar9 = iVar3 + -0x1ff;
          }
          *(int *)((long)pitch_table + lVar14) = iVar9;
        }
        iVar10 = iVar10 + -0x101;
        if (0x7f < uVar11) {
          iVar10 = iVar3 + -0x180;
        }
        *(int *)((long)amplitude_table + lVar14) = iVar10;
        uVar11 = uVar11 + 1;
        iVar3 = iVar3 + 2;
        lVar14 = lVar14 + 4;
        lVar8 = lVar8 + -2;
      } while (lVar8 != 0);
      paIVar7 = pitch_scale_tables;
      paIVar12 = amplitude_scale_tables;
      lVar8 = 0;
      do {
        fVar15 = PHASE_SCALE_LIMIT[lVar8];
        lVar14 = 0;
        do {
          fVar16 = exp2f(((float)((int)lVar14 + -0x80) * fVar15 * 0.0078125) / 1200.0);
          (*paIVar7)[lVar14] = (INT32)(long)(fVar16 * 256.0);
          lVar14 = lVar14 + 1;
        } while (lVar14 != 0x100);
        fVar15 = AMPLITUDE_SCALE_LIMIT[lVar8];
        lVar14 = 0;
        do {
          fVar16 = powf(10.0,((float)(int)lVar14 * -fVar15 * 0.00390625) / 20.0);
          (*paIVar12)[lVar14] = (INT32)(long)(fVar16 * 256.0);
          lVar14 = lVar14 + 1;
        } while (lVar14 != 0x100);
        lVar8 = lVar8 + 1;
        paIVar7 = paIVar7 + 1;
        paIVar12 = paIVar12 + 1;
      } while (lVar8 != 8);
    }
    fVar15 = *(float *)((long)DVar4.chipInf + 0x143c);
    lVar8 = 0;
    do {
      *(int *)((long)DVar4.chipInf + lVar8 * 4 + 0x1640) =
           (int)(long)(((float)(int)lVar8 + 1024.0) * fVar15 * 0.0009765625 * 4096.0);
      lVar8 = lVar8 + 1;
    } while (lVar8 != 0x400);
    lVar8 = 0;
    do {
      dVar1 = BASE_TIMES[lVar8 + 4];
      *(int *)((long)DVar4.chipInf + lVar8 * 4 + 0x1450) =
           (int)(long)(67108864.0 / (float)((dVar1 * 44100.0) / 1000.0));
      *(int *)((long)DVar4.chipInf + lVar8 * 4 + 0x1550) =
           (int)(long)(67108864.0 / (float)((dVar1 * 14.32833 * 44100.0) / 1000.0));
      lVar8 = lVar8 + 1;
    } while (lVar8 != 0x3c);
    ((DEV_DATA *)((long)DVar4.chipInf + 0x1440))->chipInf = (void *)0x0;
    ((DEV_DATA *)((long)DVar4.chipInf + 0x1448))->chipInf = (void *)0x0;
    *(undefined4 *)((long)DVar4.chipInf + 0x153c) = 0x4000000;
    ((DEV_DATA *)((long)DVar4.chipInf + 0x1540))->chipInf = (void *)0x0;
    ((DEV_DATA *)((long)DVar4.chipInf + 0x1548))->chipInf = (void *)0x0;
    ((DEV_DATA *)((long)DVar4.chipInf + 0x2640))->chipInf = (void *)0x4cffffff68;
    lVar8 = 0xb9;
    do {
      *(undefined1 *)((long)DVar4.chipInf + lVar8) = 0;
      lVar8 = lVar8 + 0xb8;
    } while (lVar8 != 0x14d9);
    *(void **)DVar4.chipInf = DVar4.chipInf;
    fVar15 = *(float *)((long)DVar4.chipInf + 0x143c);
    retDevInf->dataPtr = (DEV_DATA *)DVar4.chipInf;
    retDevInf->sampleRate = (UINT32)(long)fVar15;
    retDevInf->devDef = &devDef;
    retDevInf->linkDevCount = 0;
    retDevInf->linkDevs = (DEVLINK_INFO *)0x0;
    UVar2 = '\0';
  }
  return UVar2;
}

Assistant:

static UINT8 device_start_multipcm(const DEV_GEN_CFG* cfg, DEV_INFO* retDevInf)
{
	MultiPCM *ptChip;
	INT32 i;

	ptChip = (MultiPCM *)calloc(1, sizeof(MultiPCM));
	if (ptChip == NULL)
		return 0xFF;
	
	ptChip->ROM = NULL;
	ptChip->ROMSize = 0x00;
	ptChip->ROMMask = 0x00;
	ptChip->rate = (float)cfg->clock / MULTIPCM_CLOCKDIV;

	if (! IsInit)
	{
	INT32 level;

	IsInit = 1;

	// Volume + pan table
	for (level = 0; level < 0x80; ++level)
	{
		const float vol_db = (float)level * (-24.0f) / 64.0f;
		const float total_level = powf(10.0f, vol_db / 20.0f) / 4.0f;
		INT32 pan;

		for (pan = 0; pan < 0x10; ++pan)
		{
			float pan_left, pan_right;
			if (pan == 0x8)
			{
				pan_left = 0.0;
				pan_right = 0.0;
			}
			else if (pan == 0x0)
			{
				pan_left = 1.0;
				pan_right = 1.0;
			}
			else if (pan & 0x8)
			{
				const INT32 inverted_pan = 0x10 - pan;
				const float pan_vol_db = (float)inverted_pan * (-12.0f) / 4.0f;

				pan_left = 1.0;
				pan_right = powf(10.0f, pan_vol_db / 20.0f);

				if ((inverted_pan & 0x7) == 7)
				{
					pan_right = 0.0;
				}
			}
			else
			{
				const float pan_vol_db = (float)pan * (-12.0f) / 4.0f;

				pan_left = powf(10.0f, pan_vol_db / 20.0f);
				pan_right = 1.0;

				if ((pan & 0x7) == 7)
				{
					pan_left = 0.0;
				}
			}

			left_pan_table[(pan << 7) | level] = value_to_fixed(TL_SHIFT, pan_left * total_level);
			right_pan_table[(pan << 7) | level] = value_to_fixed(TL_SHIFT, pan_right * total_level);
		}
	}

	// build the linear->exponential ramps
	for(i = 0; i < 0x400; ++i)
	{
		const float db = -(96.0f - (96.0f * (float)i / (float)0x400));
		const float exp_volume = powf(10.0f, db / 20.0f);
		linear_to_exp_volume[i] = value_to_fixed(TL_SHIFT, exp_volume);
	}

	lfo_init();
	}

	// Pitch steps
	for (i = 0; i < 0x400; ++i)
	{
		const float fcent = ptChip->rate * (1024.0f + (float)i) / 1024.0f;
		ptChip->freq_step_table[i] = value_to_fixed(TL_SHIFT, fcent);
	}

	// Envelope steps
	envelope_generator_init(ptChip, BASE_TIMES, 14.32833);

	// Total level interpolation steps
	ptChip->total_level_steps[0] = -(float)(0x80 << TL_SHIFT) / (78.2f * 44100.0f / 1000.0f); // lower
	ptChip->total_level_steps[1] = (float)(0x80 << TL_SHIFT) / (78.2f * 2 * 44100.0f / 1000.0f); // raise

	multipcm_set_mute_mask(ptChip, 0x00);

	ptChip->_devData.chipInf = ptChip;
	INIT_DEVINF(retDevInf, &ptChip->_devData, (UINT32)ptChip->rate, &devDef);

	return 0x00;
}